

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daialg.cpp
# Opt level: O1

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *
libDAI::calcPairBeliefs
          (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
           *__return_storage_ptr__,InferenceAlgorithm *obj,VarSet *ns,bool reInit)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  VarSet *ns_00;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  long *plVar8;
  pointer pVVar9;
  VarSet *this;
  undefined4 extraout_var_00;
  ostream *poVar10;
  undefined7 in_register_00000009;
  pointer __args;
  ulong uVar11;
  ulong uVar12;
  size_type __n;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t k;
  long lVar17;
  long lVar18;
  pointer pVVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> vns;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *result;
  Complex Z;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> pairbeliefs;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> facs;
  long local_160;
  long local_158;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> local_148;
  vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *local_130;
  double local_128;
  ulong local_120;
  long local_118;
  TFactor<double> local_110;
  VarSet *local_d8;
  pointer local_d0;
  pointer local_c8;
  double local_c0;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_b8;
  long local_a0;
  TFactor<double> local_98;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  long *plVar7;
  
  local_120 = CONCAT44(local_120._4_4_,(int)CONCAT71(in_register_00000009,reInit));
  pVVar19 = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar9 = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)pVVar9 - (long)pVVar19 >> 4;
  local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (Var *)0x0;
  local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Var *)0x0;
  local_130 = (vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
              __return_storage_ptr__;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve(&local_148,__n);
  __args = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_d8 = ns;
  if (__args != (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<libDAI::Var,std::allocator<libDAI::Var>>::_M_realloc_insert<libDAI::Var_const&>
                  ((vector<libDAI::Var,std::allocator<libDAI::Var>> *)&local_148,
                   (iterator)
                   local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        sVar4 = __args->_states;
        (local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_finish)->_label = __args->_label;
        (local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
         super__Vector_impl_data._M_finish)->_states = sVar4;
        local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      __args = __args + 1;
    } while (__args != (local_d8->_vars).
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_b8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&local_b8,__n * __n);
  local_d0 = pVVar9;
  local_c8 = pVVar19;
  if (pVVar9 != pVVar19) {
    lVar15 = __n + (__n == 0);
    lVar16 = 0;
    do {
      lVar17 = 0;
      lVar18 = 0;
      do {
        if (lVar16 == lVar18) {
          TFactor<double>::TFactor(&local_110);
          std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
          emplace_back<libDAI::TFactor<double>>
                    ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                     &local_b8,&local_110);
          pVVar19 = local_110._vs._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pVVar9 = local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_110._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_110._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
            pVVar19 = local_110._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pVVar9 = local_110._vs._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          VarSet::VarSet(&local_98._vs,
                         local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar16,
                         (Var *)((long)&(local_148.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_label + lVar17
                                ));
          TFactor<double>::TFactor(&local_110,&local_98._vs);
          std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
          emplace_back<libDAI::TFactor<double>>
                    ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                     &local_b8,&local_110);
          if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_110._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_110._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pVVar19 = local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pVVar9 = local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_110._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            pVVar19 = local_98._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pVVar9 = local_98._vs._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (pVVar19 != (pointer)0x0) {
          operator_delete(pVVar19,(long)pVVar9 - (long)pVVar19);
        }
        lVar18 = lVar18 + 1;
        lVar17 = lVar17 + 0x10;
      } while (lVar15 != lVar18);
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar15);
  }
  iVar6 = (**obj->_vptr_InferenceAlgorithm)();
  plVar7 = (long *)CONCAT44(extraout_var,iVar6);
  if ((char)local_120 == '\0') {
    (**(code **)(*plVar7 + 0x70))(plVar7);
  }
  ns_00 = local_d8;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pVVar19 = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar19;
    plVar8 = (long *)(**(code **)(*plVar7 + 0x28))(plVar7);
    pVVar9 = (pointer)(**(code **)(*plVar8 + 0x48))(plVar8);
    if (pVVar9 <= pVVar19) break;
    plVar8 = (long *)(**(code **)(*plVar7 + 0x28))(plVar7);
    this = (VarSet *)
           (**(code **)(*plVar8 + 0x50))
                     (plVar8,local_110._vs._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start);
    bVar5 = VarSet::operator&&(this,ns_00);
    if (bVar5) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&local_60,(unsigned_long *)&local_110);
    }
    pVVar19 = (pointer)((long)&(local_110._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start)->_label + 1);
  }
  if (local_d0 != local_c8) {
    local_a0 = __n - 1;
    lVar15 = __n + (__n == 0);
    local_128 = 0.0;
    lVar16 = 0;
    local_c0 = 0.0;
    do {
      if (local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start[lVar16]._states != 0) {
        local_118 = lVar16 * __n * 0x38;
        uVar11 = 0;
        do {
          iVar6 = (*obj->_vptr_InferenceAlgorithm[6])();
          if (1 < CONCAT44(extraout_var_00,iVar6)) {
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," (",2);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): ",3);
          }
          plVar8 = (long *)(**(code **)(*plVar7 + 0x28))(plVar7);
          (**(code **)(*plVar8 + 0x98))
                    (plVar8,local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar16,uVar11,1);
          if ((char)local_120 == '\0') {
            (**(code **)(*plVar7 + 0x78))(plVar7,local_d8);
          }
          else {
            (**(code **)(*plVar7 + 0x70))(plVar7);
          }
          (**(code **)(*plVar7 + 0x80))(plVar7);
          if (uVar11 == 0 && lVar16 == 0) {
            auVar22 = (**(code **)(*plVar7 + 0x68))(plVar7);
            pVVar19 = (pointer)0x3ff0000000000000;
          }
          else {
            auVar22 = (**(code **)(*plVar7 + 0x68))(plVar7);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = auVar22._8_8_ - local_128;
            local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)cexp(auVar22._0_8_ - local_c0);
            auVar22._8_8_ = local_128;
            auVar22._0_8_ = local_c0;
            local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_finish = auVar21._0_8_;
            auVar20._8_8_ = 0x7fffffffffffffff;
            auVar20._0_8_ = 0x7fffffffffffffff;
            auVar20 = vandpd_avx512vl(auVar21,auVar20);
            pVVar19 = local_110._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (1e-05 < auVar20._0_8_) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"calcPairBelief::  Warning: complex Z: ",0x26);
              poVar10 = std::operator<<((ostream *)&std::cout,(complex *)&local_110);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              auVar22._8_8_ = local_128;
              auVar22._0_8_ = local_c0;
              pVVar19 = local_110._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
          }
          lVar17 = 0;
          do {
            local_128 = auVar22._8_8_;
            local_c0 = auVar22._0_8_;
            if (lVar17 != lVar16) {
              (**(code **)(*plVar7 + 0x50))
                        (&local_110,plVar7,
                         local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17);
              uVar1 = local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar17]._states;
              if (uVar1 != 0) {
                lVar18 = local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar16]._label;
                lVar2 = local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar17]._label;
                lVar3 = *(long *)((long)&local_b8.
                                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar17]._p._p.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start + local_118);
                uVar13 = 0;
                do {
                  uVar12 = uVar13;
                  lVar14 = uVar1 * uVar11;
                  if (lVar18 < lVar2) {
                    lVar14 = local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar16]._states * uVar13;
                    uVar12 = uVar11;
                  }
                  *(double *)(lVar3 + uVar12 * 8 + lVar14 * 8) =
                       (double)pVVar19 *
                       local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar1 != uVar13);
              }
              if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_110._p._p.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_110._p._p.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              auVar22._8_8_ = local_128;
              auVar22._0_8_ = local_c0;
              if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_110._vs._vars.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_110._vs._vars.
                                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                auVar22._8_8_ = local_128;
                auVar22._0_8_ = local_c0;
              }
            }
            local_128 = auVar22._8_8_;
            local_c0 = auVar22._0_8_;
            lVar17 = lVar17 + 1;
          } while (lVar17 != lVar15);
          plVar8 = (long *)(**(code **)(*plVar7 + 0x28))(plVar7);
          (**(code **)(*plVar8 + 0xb0))(plVar8);
          uVar11 = uVar11 + 1;
        } while (uVar11 < local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar16]._states);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar15);
  }
  (**(code **)(*plVar7 + 0x18))(plVar7);
  *(undefined8 *)local_130 = 0;
  *(pointer *)(local_130 + 8) = (pointer)0x0;
  *(pointer *)(local_130 + 0x10) = (pointer)0x0;
  local_160 = __n - 1;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)local_130
             ,local_160 * __n >> 1);
  if (local_d0 != local_c8) {
    local_120 = __n + (__n == 0);
    lVar15 = __n * 0x38;
    local_128 = (double)(lVar15 + 0x38);
    local_118 = 0x38;
    uVar11 = 0;
    local_158 = lVar15;
    do {
      uVar11 = uVar11 + 1;
      lVar16 = local_158;
      lVar17 = local_118;
      lVar18 = local_160;
      if (uVar11 < __n) {
        do {
          TFactor<double>::operator*
                    (&local_98,
                     (TFactor<double> *)
                     ((long)&((local_b8.
                               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar17),
                     (TFactor<double> *)
                     ((long)&((local_b8.
                               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar16));
          TFactor<double>::operator^(&local_110,&local_98,0.5);
          std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
          emplace_back<libDAI::TFactor<double>>(local_130,&local_110);
          if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_110._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_110._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_110._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar18 = lVar18 + -1;
          lVar16 = lVar16 + lVar15;
          lVar17 = lVar17 + 0x38;
        } while (lVar18 != 0);
      }
      local_160 = local_160 + -1;
      local_158 = local_158 + (long)local_128;
      local_118 = local_118 + (long)local_128;
    } while (uVar11 != local_120);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_b8);
  if (local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)local_130;
}

Assistant:

std::vector<Factor> calcPairBeliefs( const InferenceAlgorithm & obj, const VarSet& ns, bool reInit ) {
        // convert ns to vector<VarSet>
        size_t N = ns.size();
        std::vector<Var> vns;
        vns.reserve( N );
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ )
            vns.push_back( *n );

        std::vector<Factor> pairbeliefs;
        pairbeliefs.reserve( N * N );
        for( size_t j = 0; j < N; j++ )
            for( size_t k = 0; k < N; k++ )
                if( j == k )
                    pairbeliefs.push_back(Factor());
                else
                    pairbeliefs.push_back(Factor(vns[j] | vns[k]));

        InferenceAlgorithm *clamped = obj.clone();
        if( !reInit )
            clamped->init();

        std::set<size_t> facs;
        for( size_t I = 0; I < clamped->grm().nrFactors(); I++ )
            if( clamped->grm().factor(I).vars() && ns )
                facs.insert( I );

        Complex logZ0;
        for( size_t j = 0; j < N; j++ ) {
            // clamp Var j to its possible values
            for( size_t j_val = 0; j_val < vns[j].states(); j_val++ ) {
                if( obj.Verbose() >= 2 )
                    std::cout << j << "/" << N-1 << " (" << j_val << "/" << vns[j].states() << "): ";

                clamped->grm().clamp( vns[j], j_val, true );
                if( reInit )
                    clamped->init();
                else
                    clamped->init(ns);
                clamped->run();

                //if( j == 0 )
                //  logZ0 = obj.logZ();
                double Z_xj = 1.0;
                if( j == 0 && j_val == 0 ) {
                    logZ0 = clamped->logZ();
                } else {
                    // subtract logZ0 to avoid very large numbers
                    Complex Z = exp(clamped->logZ() - logZ0);
                    if( fabs(imag(Z)) > 1e-5 )
                        std::cout << "calcPairBelief::  Warning: complex Z: " << Z << std::endl;
                    Z_xj = real(Z);
                }

                for( size_t k = 0; k < N; k++ ) 
                    if( k != j ) {
                        Factor b_k = clamped->belief(vns[k]);
                        for( size_t k_val = 0; k_val < vns[k].states(); k_val++ ) 
                            if( vns[j].label() < vns[k].label() )
                                pairbeliefs[j * N + k][j_val + (k_val * vns[j].states())] = Z_xj * b_k[k_val];
                            else
                                pairbeliefs[j * N + k][k_val + (j_val * vns[k].states())] = Z_xj * b_k[k_val];
                    }

                // restore clamped factors
                clamped->grm().restoreFactors();
            }
        }
        
        delete clamped;

        // Calculate result by taking the geometric average
        std::vector<Factor> result;
        result.reserve( N * (N - 1) / 2 );
        for( size_t j = 0; j < N; j++ )
            for( size_t k = j+1; k < N; k++ )
                result.push_back( (pairbeliefs[j * N + k] * pairbeliefs[k * N + j]) ^ 0.5 );

        return result;
    }